

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfe.cpp
# Opt level: O3

string * to_string_abi_cxx11_(string *__return_storage_ptr__,FloppyInterfaceMode interface_mode)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(interface_mode) {
  case IBMPC_DD_FLOPPYMODE:
    pcVar2 = "IBMPC_DD_FLOPPYMODE";
    pcVar1 = "";
    break;
  case IBMPC_HD_FLOPPYMODE:
    pcVar2 = "IBMPC_HD_FLOPPYMODE";
    pcVar1 = "";
    break;
  case ATARIST_DD_FLOPPYMODE:
    pcVar2 = "ATARIST_DD_FLOPPYMODE";
    pcVar1 = "";
    break;
  case ATARIST_HD_FLOPPYMODE:
    pcVar2 = "ATARIST_HD_FLOPPYMODE";
    pcVar1 = "";
    break;
  case AMIGA_DD_FLOPPYMODE:
    pcVar2 = "AMIGA_DD_FLOPPYMODE";
    pcVar1 = "";
    break;
  case AMIGA_HD_FLOPPYMODE:
    pcVar2 = "AMIGA_HD_FLOPPYMODE";
    pcVar1 = "";
    break;
  case CPC_DD_FLOPPYMODE:
    pcVar2 = "CPC_DD_FLOPPYMODE";
    pcVar1 = "";
    break;
  case GENERIC_SHUGART_DD_FLOPPYMODE:
    pcVar2 = "GENERIC_SHUGART_DD_FLOPPYMODE";
    pcVar1 = "";
    break;
  case IBMPC_ED_FLOPPYMODE:
    pcVar2 = "IBMPC_ED_FLOPPYMODE";
    pcVar1 = "";
    break;
  case MSX2_DD_FLOPPYMODE:
    pcVar2 = "MSX2_DD_FLOPPYMODE";
    pcVar1 = "";
    break;
  case C64_DD_FLOPPYMODE:
    pcVar2 = "C64_DD_FLOPPYMODE";
    pcVar1 = "";
    break;
  case EMU_SHUGART_FLOPPYMODE:
    pcVar2 = "EMU_SHUGART_FLOPPYMODE";
    pcVar1 = "";
    break;
  case S950_DD_FLOPPYMODE:
    pcVar2 = "S950_DD_FLOPPYMODE";
    pcVar1 = "";
    break;
  case S950_HD_FLOPPYMODE:
    pcVar2 = "S950_HD_FLOPPYMODE";
    pcVar1 = "";
    break;
  default:
    if (interface_mode == DISABLE_FLOPPYMODE) {
      pcVar2 = "DISABLE_FLOPPYMODE";
      pcVar1 = "";
    }
    else {
      pcVar2 = "Unknown";
      pcVar1 = "";
    }
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(FloppyInterfaceMode interface_mode)
{
    switch (interface_mode)
    {
    case IBMPC_DD_FLOPPYMODE:   return "IBMPC_DD_FLOPPYMODE";   break;
    case IBMPC_HD_FLOPPYMODE:   return "IBMPC_HD_FLOPPYMODE";   break;
    case ATARIST_DD_FLOPPYMODE: return "ATARIST_DD_FLOPPYMODE"; break;
    case ATARIST_HD_FLOPPYMODE: return "ATARIST_HD_FLOPPYMODE"; break;
    case AMIGA_DD_FLOPPYMODE:   return "AMIGA_DD_FLOPPYMODE";   break;
    case AMIGA_HD_FLOPPYMODE:   return "AMIGA_HD_FLOPPYMODE";   break;
    case CPC_DD_FLOPPYMODE:     return "CPC_DD_FLOPPYMODE";     break;
    case GENERIC_SHUGART_DD_FLOPPYMODE: return "GENERIC_SHUGART_DD_FLOPPYMODE"; break;
    case IBMPC_ED_FLOPPYMODE:   return "IBMPC_ED_FLOPPYMODE";   break;
    case MSX2_DD_FLOPPYMODE:    return "MSX2_DD_FLOPPYMODE";    break;
    case C64_DD_FLOPPYMODE:     return "C64_DD_FLOPPYMODE";     break;
    case EMU_SHUGART_FLOPPYMODE:return "EMU_SHUGART_FLOPPYMODE"; break;
    case S950_DD_FLOPPYMODE:    return "S950_DD_FLOPPYMODE";    break;
    case S950_HD_FLOPPYMODE:    return "S950_HD_FLOPPYMODE";    break;
    case DISABLE_FLOPPYMODE:    return "DISABLE_FLOPPYMODE";    break;
    }
    return "Unknown";
}